

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O1

UBool uhash_compareIChars_63(UHashTok key1,UHashTok key2)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char *p2;
  char *p1;
  bool bVar4;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    bVar4 = false;
  }
  else {
    cVar2 = *key1.pointer;
    while (cVar2 != '\0') {
      cVar2 = uprv_asciitolower_63(cVar2);
      cVar3 = uprv_asciitolower_63(*key2.pointer);
      if (cVar2 != cVar3) break;
      key2.pointer = key2.pointer + 1;
      pcVar1 = (char *)((long)key1.pointer + 1);
      key1.pointer = key1.pointer + 1;
      cVar2 = *pcVar1;
    }
    bVar4 = *key1.pointer == *key2.pointer;
  }
  return bVar4;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareIChars(const UHashTok key1, const UHashTok key2) {
    const char *p1 = (const char*) key1.pointer;
    const char *p2 = (const char*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && uprv_tolower(*p1) == uprv_tolower(*p2)) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}